

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignaturePruning.cpp
# Opt level: O3

Pass * wasm::createSignaturePruningPass(void)

{
  Pass *pPVar1;
  
  pPVar1 = (Pass *)operator_new(0x68);
  (pPVar1->name)._M_dataplus._M_p = (pointer)0x0;
  (pPVar1->name)._M_string_length = 0;
  (pPVar1->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(pPVar1->name).field_2 + 8) = 0;
  pPVar1->_vptr_Pass = (_func_int **)0x0;
  pPVar1->runner = (PassRunner *)0x0;
  pPVar1[1]._vptr_Pass = (_func_int **)0x0;
  pPVar1[1].runner = (PassRunner *)0x0;
  pPVar1[1].name.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&pPVar1[1].name.field_2 + 8) = 0;
  pPVar1[1].name._M_dataplus._M_p = (pointer)0x0;
  pPVar1[1].name._M_string_length = 0;
  (pPVar1->name)._M_dataplus._M_p = (pointer)&(pPVar1->name).field_2;
  (pPVar1->name).field_2._M_local_buf[0] = '\0';
  pPVar1->_vptr_Pass = (_func_int **)&PTR__SignaturePruning_00d754e0;
  pPVar1[1]._vptr_Pass = (_func_int **)(pPVar1 + 2);
  pPVar1[1].runner = (PassRunner *)&DAT_00000001;
  *(undefined4 *)&pPVar1[1].name.field_2 = 0x3f800000;
  *(undefined8 *)((long)&pPVar1[1].name.field_2 + 8) = 0;
  pPVar1[2]._vptr_Pass = (_func_int **)0x0;
  return pPVar1;
}

Assistant:

Pass* createSignaturePruningPass() { return new SignaturePruning(); }